

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

bool __thiscall roaring::Roaring64Map::isSubset(Roaring64Map *this,Roaring64Map *r)

{
  bool bVar1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  p_Var4 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var3 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var4; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    bVar1 = Roaring::isEmpty((Roaring *)&p_Var3[1]._M_parent);
    if (!bVar1) {
      cVar2 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
              ::find((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                      *)r,&p_Var3[1]._M_color);
      if ((_Rb_tree_header *)cVar2._M_node == &(r->roarings)._M_t._M_impl.super__Rb_tree_header)
      break;
      bVar1 = Roaring::isSubset((Roaring *)&p_Var3[1]._M_parent,
                                (Roaring *)&cVar2._M_node[1]._M_parent);
      if (!bVar1) break;
    }
  }
  return (_Rb_tree_header *)p_Var3 == p_Var4;
}

Assistant:

bool isSubset(const Roaring64Map &r) const {
        for (const auto &map_entry : roarings) {
            if (map_entry.second.isEmpty()) {
                continue;
            }
            auto roaring_iter = r.roarings.find(map_entry.first);
            if (roaring_iter == r.roarings.cend())
                return false;
            else if (!map_entry.second.isSubset(roaring_iter->second))
                return false;
        }
        return true;
    }